

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_lib.c
# Opt level: O0

int OSSL_parse_url(char *url,char **pscheme,char **puser,char **phost,char **pport,int *pport_num,
                  char **ppath,char **pquery,char **pfrag)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char **in_RCX;
  char **in_RDX;
  char **in_RSI;
  char **in_RDI;
  char **in_R8;
  uint *in_R9;
  char **in_stack_00000008;
  char **in_stack_00000010;
  char **in_stack_00000018;
  size_t buflen;
  char *frag_end;
  char *frag;
  char *query_end;
  char *query;
  char *path_end;
  char *path;
  uint portnum;
  char *port_end;
  char *port;
  char *host_end;
  char *host;
  char *user_end;
  char *user;
  char *scheme_end;
  char *scheme;
  char *tmp;
  char *p;
  char *in_stack_ffffffffffffff20;
  char **end;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  uint uVar6;
  char **in_stack_ffffffffffffff30;
  char **local_a8;
  char **local_a0;
  uint local_8c;
  char **local_88;
  char **local_80;
  char **local_78;
  char **local_70;
  char **local_68;
  char **local_60;
  char **local_58;
  char **local_50;
  char **local_48;
  char **local_40;
  uint *local_38;
  char **local_30;
  
  local_38 = in_R9;
  local_30 = in_R8;
  init_pstring(in_RSI);
  init_pstring(in_RDX);
  init_pstring(in_RCX);
  init_pstring(local_30);
  init_pstring(in_stack_00000008);
  init_pstring(in_stack_00000018);
  init_pstring(in_stack_00000010);
  if (in_RDI == (char **)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                  in_stack_ffffffffffffff20);
    ERR_set_error(0x3d,0xc0102,(char *)0x0);
    return 0;
  }
  local_58 = in_RDI;
  local_50 = in_RDI;
  local_40 = (char **)strstr((char *)in_RDI,"://");
  ppcVar2 = in_RDI;
  if (local_40 == (char **)0x0) {
LAB_0043dfc3:
    local_40 = ppcVar2;
    local_70 = local_40;
    local_68 = local_40;
    local_60 = local_40;
    ppcVar2 = (char **)strchr((char *)local_40,0x40);
    if (ppcVar2 == (char **)0x0) {
      local_70 = local_40;
    }
    else {
      local_70 = (char **)((long)ppcVar2 + 1);
      local_68 = ppcVar2;
    }
    if (*(char *)local_70 == '[') {
      pcVar3 = strchr((char *)((long)local_70 + 1),0x5d);
      if (pcVar3 == (char *)0x0) {
        local_78 = (char **)0x0;
        goto LAB_0043e520;
      }
      local_78 = (char **)(pcVar3 + 1);
    }
    else {
      local_78 = (char **)strchr((char *)local_70,0x3a);
      if (local_78 == (char **)0x0) {
        local_78 = (char **)strchr((char *)local_70,0x2f);
      }
      if (local_78 == (char **)0x0) {
        local_78 = (char **)strchr((char *)local_70,0x3f);
      }
      if (local_78 == (char **)0x0) {
        local_78 = (char **)strchr((char *)local_70,0x23);
      }
      if (local_78 == (char **)0x0) {
        in_stack_ffffffffffffff30 = local_70;
        sVar4 = strlen((char *)local_70);
        local_78 = (char **)((long)in_stack_ffffffffffffff30 + sVar4);
      }
    }
    local_80 = (char **)0x5008c9;
    local_40 = local_78;
    if (*(char *)local_78 == ':') {
      local_80 = (char **)((long)local_78 + 1);
      local_40 = local_80;
    }
    iVar1 = __isoc99_sscanf(local_80,"%u",&local_8c);
    if ((iVar1 == 0) || (0xffff < local_8c)) {
      ERR_new();
      ERR_set_debug((char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                    in_stack_ffffffffffffff20);
      ERR_set_error(0x3d,0x7b,"%s",local_80);
      goto LAB_0043e552;
    }
    local_88 = local_80;
    uVar6 = in_stack_ffffffffffffff2c;
    while( true ) {
      in_stack_ffffffffffffff2c = uVar6 & 0xffffff;
      if ('/' < *(char *)local_88) {
        in_stack_ffffffffffffff2c = CONCAT13(*(char *)local_88 < ':',(int3)uVar6);
      }
      if ((char)(in_stack_ffffffffffffff2c >> 0x18) == '\0') break;
      local_88 = (char **)((long)local_88 + 1);
      uVar6 = in_stack_ffffffffffffff2c;
    }
    if (local_80 == local_40) {
      local_40 = (char **)(((long)local_88 - (long)local_80) + (long)local_40);
    }
    ppcVar2 = local_40;
    if ((((*(char *)local_40 == '\0') || (*(char *)local_40 == '/')) || (*(char *)local_40 == '?'))
       || (*(char *)local_40 == '#')) {
      end = local_40;
      sVar4 = strlen((char *)local_40);
      local_a8 = (char **)((long)end + sVar4);
      local_48 = (char **)strchr((char *)local_40,0x3f);
      local_a0 = local_a8;
      if ((local_48 != (char **)0x0) &&
         (local_a0 = local_a8, local_40 = local_48, in_stack_00000010 != (char **)0x0)) {
        local_a8 = (char **)((long)local_48 + 1);
        local_a0 = local_48;
      }
      local_48 = (char **)strchr((char *)local_40,0x23);
      if ((local_48 != (char **)0x0) && (local_a8 == local_a0)) {
        local_a0 = local_48;
      }
      iVar1 = copy_substring(in_stack_ffffffffffffff30,
                             (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                             (char *)end);
      if (((((iVar1 != 0) &&
            (iVar1 = copy_substring(in_stack_ffffffffffffff30,
                                    (char *)CONCAT44(in_stack_ffffffffffffff2c,
                                                     in_stack_ffffffffffffff28),(char *)end),
            iVar1 != 0)) &&
           (iVar1 = copy_substring(in_stack_ffffffffffffff30,
                                   (char *)CONCAT44(in_stack_ffffffffffffff2c,
                                                    in_stack_ffffffffffffff28),(char *)end),
           iVar1 != 0)) &&
          ((iVar1 = copy_substring(in_stack_ffffffffffffff30,
                                   (char *)CONCAT44(in_stack_ffffffffffffff2c,
                                                    in_stack_ffffffffffffff28),(char *)end),
           iVar1 != 0 &&
           (iVar1 = copy_substring(in_stack_ffffffffffffff30,
                                   (char *)CONCAT44(in_stack_ffffffffffffff2c,
                                                    in_stack_ffffffffffffff28),(char *)end),
           iVar1 != 0)))) &&
         (iVar1 = copy_substring(in_stack_ffffffffffffff30,
                                 (char *)CONCAT44(in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28),(char *)end),
         iVar1 != 0)) {
        if (local_38 != (uint *)0x0) {
          *local_38 = local_8c;
        }
        if (*(char *)ppcVar2 == '/') {
          iVar1 = copy_substring(in_stack_ffffffffffffff30,
                                 (char *)CONCAT44(in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28),(char *)end);
          if (iVar1 == 0) goto LAB_0043e552;
        }
        else if (in_stack_00000008 != (char **)0x0) {
          pcVar3 = (char *)((long)local_a0 + (2 - (long)ppcVar2));
          pcVar5 = (char *)CRYPTO_malloc((int)pcVar3,"crypto/http/http_lib.c",0xa4);
          *in_stack_00000008 = pcVar5;
          if (pcVar5 == (char *)0x0) goto LAB_0043e552;
          BIO_snprintf(*in_stack_00000008,(size_t)pcVar3,"/%s",ppcVar2);
        }
        return 1;
      }
      goto LAB_0043e552;
    }
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                  in_stack_ffffffffffffff20);
    ERR_set_error(0x3d,0x7d,(char *)0x0);
  }
  else {
    local_58 = local_40;
    if (local_40 != local_50) {
      ppcVar2 = (char **)((long)local_40 + 3);
      goto LAB_0043dfc3;
    }
  }
LAB_0043e520:
  ERR_new();
  ERR_set_debug((char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                in_stack_ffffffffffffff20);
  ERR_set_error(0x3d,0x65,(char *)0x0);
LAB_0043e552:
  free_pstring((char **)0x43e55f);
  free_pstring((char **)0x43e56c);
  free_pstring((char **)0x43e579);
  free_pstring((char **)0x43e586);
  free_pstring((char **)0x43e593);
  free_pstring((char **)0x43e5a0);
  free_pstring((char **)0x43e5ad);
  return 0;
}

Assistant:

int OSSL_parse_url(const char *url, char **pscheme, char **puser, char **phost,
                   char **pport, int *pport_num,
                   char **ppath, char **pquery, char **pfrag)
{
    const char *p, *tmp;
    const char *scheme, *scheme_end;
    const char *user, *user_end;
    const char *host, *host_end;
    const char *port, *port_end;
    unsigned int portnum;
    const char *path, *path_end;
    const char *query, *query_end;
    const char *frag, *frag_end;

    init_pstring(pscheme);
    init_pstring(puser);
    init_pstring(phost);
    init_pstring(pport);
    init_pstring(ppath);
    init_pstring(pfrag);
    init_pstring(pquery);

    if (url == NULL) {
        ERR_raise(ERR_LIB_HTTP, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }

    /* check for optional prefix "<scheme>://" */
    scheme = scheme_end = url;
    p = strstr(url, "://");
    if (p == NULL) {
        p = url;
    } else {
        scheme_end = p;
        if (scheme_end == scheme)
            goto parse_err;
        p += strlen("://");
    }

    /* parse optional "userinfo@" */
    user = user_end = host = p;
    host = strchr(p, '@');
    if (host != NULL)
        user_end = host++;
    else
        host = p;

    /* parse host name/address as far as needed here */
    if (host[0] == '[') {
        /* ipv6 literal, which may include ':' */
        host_end = strchr(host + 1, ']');
        if (host_end == NULL)
            goto parse_err;
        p = ++host_end;
    } else {
        /* look for start of optional port, path, query, or fragment */
        host_end = strchr(host, ':');
        if (host_end == NULL)
            host_end = strchr(host, '/');
        if (host_end == NULL)
            host_end = strchr(host, '?');
        if (host_end == NULL)
            host_end = strchr(host, '#');
        if (host_end == NULL) /* the remaining string is just the hostname */
            host_end = host + strlen(host);
        p = host_end;
    }

    /* parse optional port specification starting with ':' */
    port = "0"; /* default */
    if (*p == ':')
        port = ++p;
    /* remaining port spec handling is also done for the default values */
    /* make sure a decimal port number is given */
    if (!sscanf(port, "%u", &portnum) || portnum > 65535) {
        ERR_raise_data(ERR_LIB_HTTP, HTTP_R_INVALID_PORT_NUMBER, "%s", port);
        goto err;
    }
    for (port_end = port; '0' <= *port_end && *port_end <= '9'; port_end++)
        ;
    if (port == p) /* port was given explicitly */
        p += port_end - port;

    /* check for optional path starting with '/' or '?'. Else must start '#' */
    path = p;
    if (*path != '\0' && *path != '/' && *path != '?' && *path != '#') {
        ERR_raise(ERR_LIB_HTTP, HTTP_R_INVALID_URL_PATH);
        goto parse_err;
    }
    path_end = query = query_end = frag = frag_end = path + strlen(path);

    /* parse optional "?query" */
    tmp = strchr(p, '?');
    if (tmp != NULL) {
        p = tmp;
        if (pquery != NULL) {
            path_end = p;
            query = p + 1;
        }
    }

    /* parse optional "#fragment" */
    tmp = strchr(p, '#');
    if (tmp != NULL) {
        if (query == path_end) /* we did not record a query component */
            path_end = tmp;
        query_end = tmp;
        frag = tmp + 1;
    }

    if (!copy_substring(pscheme, scheme, scheme_end)
            || !copy_substring(phost, host, host_end)
            || !copy_substring(pport, port, port_end)
            || !copy_substring(puser, user, user_end)
            || !copy_substring(pquery, query, query_end)
            || !copy_substring(pfrag, frag, frag_end))
        goto err;
    if (pport_num != NULL)
        *pport_num = (int)portnum;
    if (*path == '/') {
        if (!copy_substring(ppath, path, path_end))
            goto err;
    } else if (ppath != NULL) { /* must prepend '/' */
        size_t buflen = 1 + path_end - path + 1;

        if ((*ppath = OPENSSL_malloc(buflen)) == NULL)
            goto err;
        BIO_snprintf(*ppath, buflen, "/%s", path);
    }
    return 1;

 parse_err:
    ERR_raise(ERR_LIB_HTTP, HTTP_R_ERROR_PARSING_URL);

 err:
    free_pstring(pscheme);
    free_pstring(puser);
    free_pstring(phost);
    free_pstring(pport);
    free_pstring(ppath);
    free_pstring(pquery);
    free_pstring(pfrag);
    return 0;
}